

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::ItemAdd(ImRect *bb,ImGuiID id,ImRect *nav_bb_arg)

{
  ImGuiWindow *window_00;
  ImGuiContext *pIVar1;
  bool bVar2;
  ImRect *local_50;
  bool is_clipped;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImRect *nav_bb_arg_local;
  ImGuiID id_local;
  ImRect *bb_local;
  
  pIVar1 = GImGui;
  window_00 = GImGui->CurrentWindow;
  if (((id != 0) &&
      ((((window_00->DC).NavLayerActiveMaskNext =
              (window_00->DC).NavLayerCurrentMask | (window_00->DC).NavLayerActiveMaskNext,
        pIVar1->NavId == id || ((pIVar1->NavAnyRequest & 1U) != 0)) &&
       (pIVar1->NavWindow->RootWindowForNav == window_00->RootWindowForNav)))) &&
     ((window_00 == pIVar1->NavWindow ||
      (((window_00->Flags | pIVar1->NavWindow->Flags) & 0x800000U) != 0)))) {
    local_50 = bb;
    if (nav_bb_arg != (ImRect *)0x0) {
      local_50 = nav_bb_arg;
    }
    NavProcessItem(window_00,local_50,id);
  }
  (window_00->DC).LastItemId = id;
  (window_00->DC).LastItemRect.Min = bb->Min;
  (window_00->DC).LastItemRect.Max = bb->Max;
  (window_00->DC).LastItemStatusFlags = 0;
  (pIVar1->NextItemData).Flags = 0;
  bVar2 = IsClippedEx(bb,id,false);
  if (bVar2) {
    bb_local._7_1_ = false;
  }
  else {
    bVar2 = IsMouseHoveringRect(&bb->Min,&bb->Max,true);
    if (bVar2) {
      (window_00->DC).LastItemStatusFlags = (window_00->DC).LastItemStatusFlags | 1;
    }
    bb_local._7_1_ = true;
  }
  return bb_local._7_1_;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, ImGuiID id, const ImRect* nav_bb_arg)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (id != 0)
    {
        // Navigation processing runs prior to clipping early-out
        //  (a) So that NavInitRequest can be honored, for newly opened windows to select a default widget
        //  (b) So that we can scroll up/down past clipped items. This adds a small O(N) cost to regular navigation requests 
        //      unfortunately, but it is still limited to one window. It may not scale very well for windows with ten of 
        //      thousands of item, but at least NavMoveRequest is only set on user interaction, aka maximum once a frame.
        //      We could early out with "if (is_clipped && !g.NavInitRequest) return false;" but when we wouldn't be able
        //      to reach unclipped widgets. This would work if user had explicit scrolling control (e.g. mapped on a stick).
        // We intentionally don't check if g.NavWindow != NULL because g.NavAnyRequest should only be set when it is non null.
        // If we crash on a NULL g.NavWindow we need to fix the bug elsewhere.
        window->DC.NavLayerActiveMaskNext |= window->DC.NavLayerCurrentMask;
        if (g.NavId == id || g.NavAnyRequest)
            if (g.NavWindow->RootWindowForNav == window->RootWindowForNav)
                if (window == g.NavWindow || ((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened))
                    NavProcessItem(window, nav_bb_arg ? *nav_bb_arg : bb, id);

        // [DEBUG] Item Picker tool, when enabling the "extended" version we perform the check in ItemAdd()
#ifdef IMGUI_DEBUG_TOOL_ITEM_PICKER_EX
        if (id == g.DebugItemPickerBreakID)
        {
            IM_DEBUG_BREAK();
            g.DebugItemPickerBreakID = 0;
        }
#endif
    }

    window->DC.LastItemId = id;
    window->DC.LastItemRect = bb;
    window->DC.LastItemStatusFlags = ImGuiItemStatusFlags_None;
    g.NextItemData.Flags = ImGuiNextItemDataFlags_None;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0)
        IMGUI_TEST_ENGINE_ITEM_ADD(nav_bb_arg ? *nav_bb_arg : bb, id);
#endif

    // Clipping test
    const bool is_clipped = IsClippedEx(bb, id, false);
    if (is_clipped)
        return false;
    //if (g.IO.KeyAlt) window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255,255,0,120)); // [DEBUG]

    // We need to calculate this now to take account of the current clipping rectangle (as items like Selectable may change them)
    if (IsMouseHoveringRect(bb.Min, bb.Max))
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HoveredRect;
    return true;
}